

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_image_opt.cpp
# Opt level: O2

void compute_integral_img_faster_alg(float *gray_image,integral_image *iimage)

{
  long lVar1;
  float fVar2;
  int iVar3;
  float fVar4;
  long lVar5;
  float *pfVar6;
  long lVar7;
  int j_1;
  int j;
  long lVar8;
  long lVar9;
  long lVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  long lVar16;
  long lVar17;
  float *pfVar18;
  float *pfVar19;
  float fVar20;
  float fVar21;
  float *local_88;
  float *local_80;
  long local_78;
  
  lVar7 = (long)iimage->width;
  lVar16 = (long)iimage->data_width;
  pfVar11 = iimage->data;
  iVar3 = iimage->height;
  fVar20 = 0.0;
  fVar21 = 0.0;
  pfVar13 = pfVar11 + lVar16 + 1;
  lVar1 = lVar7 + -2;
  for (lVar5 = 0; lVar5 < lVar1; lVar5 = lVar5 + 2) {
    fVar4 = fVar21 + gray_image[lVar5];
    pfVar11[lVar5] = fVar4;
    fVar21 = fVar4 + gray_image[lVar5 + 1];
    pfVar11[lVar5 + 1] = fVar21;
    fVar2 = gray_image[lVar7 + lVar5];
    pfVar13[lVar5 + -1] = fVar4 + fVar20 + fVar2;
    fVar20 = fVar20 + fVar2 + gray_image[lVar7 + lVar5 + 1];
    pfVar13[lVar5] = fVar20 + pfVar11[lVar5 + 1];
  }
  pfVar12 = pfVar11 + lVar16;
  for (; lVar5 < lVar7; lVar5 = lVar5 + 1) {
    fVar21 = fVar21 + gray_image[lVar5];
    pfVar11[lVar5] = fVar21;
    fVar20 = fVar20 + gray_image[lVar7 + lVar5];
    pfVar12[lVar5] = fVar21 + fVar20;
  }
  pfVar14 = pfVar11 + lVar16 * 2 + 1;
  pfVar15 = gray_image + lVar7 * 2 + 1;
  local_78 = 0;
  pfVar19 = pfVar11 + lVar16 * 3 + 1;
  pfVar6 = gray_image + lVar7 * 3 + 1;
  lVar10 = 0;
  pfVar18 = pfVar11 + lVar16 * 2;
  local_88 = pfVar12;
  local_80 = gray_image + lVar7 * 2;
  for (lVar5 = 2; lVar5 < (long)iVar3 + -2; lVar5 = lVar5 + 2) {
    fVar20 = 0.0;
    fVar21 = 0.0;
    lVar9 = local_78;
    lVar17 = lVar10;
    for (lVar8 = 0; lVar8 < lVar1; lVar8 = lVar8 + 2) {
      fVar2 = pfVar15[lVar8 + -1];
      lVar9 = lVar9 + 8;
      lVar17 = lVar17 + 8;
      fVar4 = fVar21 + fVar2 + pfVar13[lVar8 + -1];
      pfVar14[lVar8 + -1] = fVar4;
      fVar21 = fVar21 + fVar2 + pfVar15[lVar8];
      pfVar14[lVar8] = fVar21 + pfVar13[lVar8];
      fVar2 = pfVar6[lVar8 + -1];
      pfVar19[lVar8 + -1] = fVar4 + fVar20 + fVar2;
      fVar20 = fVar20 + fVar2 + pfVar6[lVar8];
      pfVar19[lVar8] = fVar20 + pfVar14[lVar8];
    }
    for (; lVar8 < lVar7; lVar8 = lVar8 + 1) {
      fVar21 = fVar21 + *(float *)((long)(gray_image + lVar7 * 2) + lVar17);
      fVar2 = fVar21 + *(float *)((long)pfVar12 + lVar9);
      *(float *)((long)(pfVar11 + lVar16 * 2) + lVar9) = fVar2;
      fVar20 = fVar20 + *(float *)((long)gray_image + lVar17 + lVar7 * 0xc);
      lVar17 = lVar17 + 4;
      *(float *)((long)pfVar11 + lVar9 + lVar16 * 0xc) = fVar2 + fVar20;
      lVar9 = lVar9 + 4;
    }
    pfVar14 = pfVar14 + lVar16 * 2;
    pfVar13 = pfVar13 + lVar16 * 2;
    pfVar18 = pfVar18 + lVar16 * 2;
    local_88 = local_88 + lVar16 * 2;
    pfVar19 = pfVar19 + lVar16 * 2;
    local_78 = local_78 + lVar16 * 8;
    local_80 = local_80 + lVar7 * 2;
    pfVar15 = pfVar15 + lVar7 * 2;
    pfVar6 = pfVar6 + lVar7 * 2;
    lVar10 = lVar10 + lVar7 * 8;
  }
  for (; lVar5 < iVar3; lVar5 = lVar5 + 1) {
    fVar21 = 0.0;
    pfVar11 = local_80;
    pfVar12 = local_88;
    pfVar19 = pfVar18;
    for (lVar10 = 0; lVar10 < lVar1; lVar10 = lVar10 + 2) {
      fVar20 = pfVar15[lVar10 + -1];
      pfVar19 = pfVar19 + 2;
      pfVar12 = pfVar12 + 2;
      pfVar11 = pfVar11 + 2;
      pfVar14[lVar10 + -1] = fVar21 + fVar20 + pfVar13[lVar10 + -1];
      fVar21 = fVar21 + fVar20 + pfVar15[lVar10];
      pfVar14[lVar10] = fVar21 + pfVar13[lVar10];
    }
    for (; lVar10 < lVar7; lVar10 = lVar10 + 1) {
      fVar21 = fVar21 + *pfVar11;
      pfVar11 = pfVar11 + 1;
      fVar20 = *pfVar12;
      pfVar12 = pfVar12 + 1;
      *pfVar19 = fVar21 + fVar20;
      pfVar19 = pfVar19 + 1;
    }
    pfVar14 = pfVar14 + lVar16;
    pfVar13 = pfVar13 + lVar16;
    pfVar15 = pfVar15 + lVar7;
    pfVar18 = pfVar18 + lVar16;
    local_88 = local_88 + lVar16;
    local_80 = local_80 + lVar7;
  }
  return;
}

Assistant:

void compute_integral_img_faster_alg(float *gray_image, struct integral_image * iimage) {
    
    float sum = 0.0f;
    float sum1 = 0.0f;
    
    int data_width = iimage->data_width;
    int width = iimage->width;
    int width_limit = width - 2;
    int height_limit = iimage->height - 2;
    float *iimage_data = iimage->data;

    int i = 0;
    // first row extra, since we don't have 0 padding
    for (i = 0; i < width_limit; i += 2) {
        sum += gray_image[i];
        iimage_data[i] = sum;
        sum += gray_image[i + 1];
        iimage_data[i + 1] = sum;

        sum1 += gray_image[width + i];
        iimage_data[data_width + i] = iimage_data[i] + sum1;
        sum1 += gray_image[width + i + 1];
        iimage_data[data_width + i + 1] = iimage_data[i + 1] + sum1;
    }

    // Handle last element of an image with odd width extra.
    // If previous stride = 2, then there should only be one element covered in this loop.
    // This might change if we increase the stride.
    for (; i < width; ++i) {
        sum += gray_image[i];
        iimage_data[i] = sum;
        // printf("row 0, col %i sum: %f\n", i, sum);
        sum1 += gray_image[width + i];
        // printf("row 1, col %i sum: %f\n", i, sum1);
        iimage_data[data_width + i] = iimage_data[i] + sum1;
    }

    // Handle all elements after the first row.
    i = 2;
    for (; i < height_limit; i += 2) {
        sum = 0.0f;
        sum1 = 0.0f;
        int j = 0;
        for (; j < width_limit; j += 2) {
            sum += gray_image[i * width + j];
            iimage_data[i * data_width + j] = iimage_data[(i - 1) * data_width + j] + sum;
            sum += gray_image[i * width + j + 1];
            iimage_data[i * data_width + j + 1] = iimage_data[(i - 1) * data_width + j + 1] + sum;

            sum1 += gray_image[(i + 1) * width + j];
            iimage_data[(i + 1) * data_width + j] = iimage_data[i * data_width + j] + sum1;
            sum1 += gray_image[(i + 1) * width + j + 1];
            iimage_data[(i + 1) * data_width + j + 1] = iimage_data[i * data_width + j + 1] + sum1;
        }
        // printf("j: %i\n", j);

        // Handle last element of an image with odd width extra.
        // If previous stride = 2, then there should only be one element covered in this loop.
        // This might change if we increase the stride.
        for (; j < width; ++j) {
            // printf("j: %i; sum1: %f\n", j, sum1);
            sum += gray_image[i * width + j];
            iimage_data[i * data_width + j] = iimage_data[(i - 1) * data_width + j] + sum;

            sum1 += gray_image[(i + 1) * width + j];
            // printf("sum1: %f\n", sum1);
            iimage_data[(i + 1) * data_width + j] = iimage_data[i * data_width + j] + sum1;
        }
    }

    // Handle last element of an image with odd height extra.
    // If previous stride = 2, then there should only be one row covered in this loop.
    // This might change if we increase the stride.
    for (; i < iimage->height ; ++i) {
        sum = 0.0f;
        int j = 0;
        for (; j < width_limit; j += 2) {
            // printf("j: %i; sum1: %f\n", j, sum);

            sum += gray_image[i * width + j];
            // printf("j: %i; sum1: %f\n", j, sum);
            iimage_data[i * data_width + j] = iimage_data[(i - 1) * data_width + j] + sum;
            sum += gray_image[i * width + j + 1];
            // printf("j: %i; sum1: %f\n", j, sum);

            iimage_data[i * data_width + j + 1] = iimage_data[(i - 1) * data_width + j + 1] + sum;
        }
        // printf("j: %i\n", j);

        for (; j < width; ++j) {
            sum += gray_image[i * width + j];
            // printf("j: %i; sum1: %f\n", j, sum);

            iimage_data[i * data_width + j] = iimage_data[(i - 1) * data_width + j] + sum;
        }
    }
}